

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::SectionTracker::SectionTracker
          (SectionTracker *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,
          ITracker *parent)

{
  int iVar1;
  undefined4 extraout_var;
  SectionTracker *in_RCX;
  string *in_RDI;
  SectionTracker *parentSection;
  ITracker *in_stack_ffffffffffffff98;
  TrackerContext *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  TrackerBase *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  TrackerBase::TrackerBase
            (in_stack_ffffffffffffffb0,
             (NameAndLocation *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(undefined ***)in_RDI = &PTR__SectionTracker_004d2980;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x315843);
  trim(in_RDI);
  if (in_RCX != (SectionTracker *)0x0) {
    while (iVar1 = (*(in_RCX->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])(),
          (((byte)iVar1 ^ 0xff) & 1) != 0) {
      iVar1 = (*(in_RCX->super_TrackerBase).super_ITracker._vptr_ITracker[7])();
      in_RCX = (SectionTracker *)CONCAT44(extraout_var,iVar1);
    }
    addNextFilters(in_RCX,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

SectionTracker::SectionTracker( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent )
    :   TrackerBase( nameAndLocation, ctx, parent ),
        m_trimmed_name(trim(nameAndLocation.name))
    {
        if( parent ) {
            while( !parent->isSectionTracker() )
                parent = &parent->parent();

            SectionTracker& parentSection = static_cast<SectionTracker&>( *parent );
            addNextFilters( parentSection.m_filters );
        }
    }